

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void pbrt::parse(SceneRepresentation *scene,
                unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *t)

{
  memory_resource *pmVar1;
  memory_resource *pmVar2;
  FileLoc loc;
  SceneRepresentation *pSVar3;
  undefined1 (*__s1) [16];
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  size_t *psVar8;
  size_type __rlen;
  bool bVar9;
  size_type __rlen_2;
  _Alloc_hider _Var10;
  long **pplVar11;
  long *plVar12;
  undefined8 uVar13;
  offset_in_SceneRepresentation_to_subr apiFunc;
  char *t_00;
  memory_resource *pmVar14;
  Allocator alloc_00;
  undefined1 auVar15 [16];
  double dVar16;
  string_view sVar17;
  bool formatting;
  CheckCallbackScope _;
  ParsedParameterVector params;
  string name;
  anon_class_1_0_00000001 parseError;
  Token t_1;
  optional<pbrt::Token> tok;
  string type;
  string texName;
  anon_class_8_1_6da50f9a unget;
  Allocator alloc;
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  fileStack;
  anon_class_48_6_0442aee5 basicParamListEntrypoint;
  TrackedMemoryResource memoryResource;
  optional<pbrt::Token> ungetToken;
  int in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  undefined8 uStack_558;
  SceneRepresentation *local_550;
  undefined1 local_548 [16];
  undefined1 auStack_538 [16];
  long local_528 [6];
  size_t local_4f8;
  size_t local_4f0;
  undefined1 local_4e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  anon_class_1_0_00000001 local_4b9;
  undefined1 local_4b8 [40];
  char local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  code *local_478;
  code *local_470;
  _Alloc_hider local_468;
  undefined1 (*pauStack_460) [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_458;
  ParsedParameter *local_448;
  char local_440;
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  anon_class_8_1_6da50f9a local_3f8;
  Allocator local_3f0;
  anon_class_1_0_00000001 *local_3e8;
  undefined8 local_3e0;
  code *local_3d8;
  code *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  local_3a8;
  _Any_data local_390;
  code *local_380;
  code *local_378;
  anon_class_48_6_0442aee5 local_370;
  _Any_data local_340;
  code *local_330;
  undefined1 local_320 [112];
  long local_2b0;
  undefined8 local_2a8;
  size_t local_2a0 [3];
  size_t local_288 [3];
  size_t local_270 [3];
  size_t local_258 [3];
  size_t local_240 [3];
  size_t local_228 [3];
  size_t local_210 [3];
  size_t local_1f8 [3];
  size_t local_1e0 [3];
  size_t local_1c8 [3];
  size_t local_1b0 [3];
  size_t local_198 [3];
  size_t local_180 [3];
  size_t local_168 [3];
  size_t local_150 [3];
  size_t local_138 [3];
  size_t local_120 [3];
  size_t local_108 [3];
  size_t local_f0 [3];
  size_t local_d8 [3];
  size_t local_c0 [3];
  size_t local_a8 [3];
  size_t local_90 [3];
  size_t local_78 [3];
  optional<pbrt::Token> local_60;
  
  local_550 = scene;
  if (scene == (SceneRepresentation *)0x0) {
    uStack_558._6_1_ = false;
  }
  else {
    lVar6 = __dynamic_cast(scene,&SceneRepresentation::typeinfo,&FormattingScene::typeinfo,0);
    uStack_558._6_1_ = lVar6 != 0;
  }
  local_320._8_8_ = pstd::pmr::get_default_resource();
  local_3f0.memoryResource = (memory_resource *)local_320;
  local_320._0_8_ = &PTR__memory_resource_0309cac8;
  local_320._16_8_ = 0;
  local_320._24_8_ = 0;
  local_3a8.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
  ::emplace_back<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>
            ((vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
              *)&local_3a8,t);
  local_60.set = false;
  local_488._M_allocated_capacity = (size_type)operator_new(0x28);
  local_370.nextToken = (function<pstd::optional<pbrt::Token>_(int)> *)&local_488;
  local_3f8.ungetToken = &local_60;
  local_370.unget = &local_3f8;
  local_370.formatting = (bool *)((long)&uStack_558 + 6);
  local_370.scene = &local_550;
  *(optional<pbrt::Token> **)local_488._M_allocated_capacity = local_3f8.ungetToken;
  *(vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
    **)(local_488._M_allocated_capacity + 8) =
       (vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
        *)&local_3a8;
  *(function<pstd::optional<pbrt::Token>_(int)> **)(local_488._M_allocated_capacity + 0x10) =
       local_370.nextToken;
  *(bool **)(local_488._M_allocated_capacity + 0x18) = local_370.formatting;
  *(SceneRepresentation ***)(local_488._M_allocated_capacity + 0x20) = local_370.scene;
  local_488._8_8_ = 0;
  local_478 = std::
              _Function_handler<pstd::optional<pbrt::Token>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:550:17)>
              ::_M_manager;
  local_470 = std::
              _Function_handler<pstd::optional<pbrt::Token>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:550:17)>
              ::_M_invoke;
  local_370.alloc = &local_3f0;
  local_370.parseError = &local_4b9;
  local_390._M_unused._M_object = &local_468;
  local_390._8_8_ = 0;
  local_440 = '\0';
  local_378 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:609:26)>
              ::_M_invoke;
  local_380 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:609:26)>
              ::_M_manager;
  CheckCallbackScope::CheckCallbackScope
            ((CheckCallbackScope *)((long)&uStack_558 + 7),
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_390);
  if (local_380 != (code *)0x0) {
    (*local_380)(&local_390,&local_390,__destroy_functor);
  }
  local_4b8._0_8_ = (ulong)(uint)local_4b8._4_4_ << 0x20;
  if (local_478 != (code *)0x0) {
    pmVar1 = (memory_resource *)(local_4e0 + 0x10);
    pmVar2 = (memory_resource *)(local_4b8 + 0x10);
    do {
      (*local_470)(local_548,&local_488,local_4b8);
      if (local_440 == '\x01') {
        local_440 = '\0';
      }
      if ((undefined1)local_528[1] == '\x01') {
        local_448 = (ParsedParameter *)local_528[0];
        local_468._M_p = (pointer)local_548._0_8_;
        pauStack_460 = (undefined1 (*) [16])local_548._8_8_;
        aStack_458._M_allocated_capacity = auStack_538._0_8_;
        aStack_458._8_8_ = auStack_538._8_8_;
        local_440 = '\x01';
      }
      else if (local_440 == '\0') {
        CheckCallbackScope::~CheckCallbackScope((CheckCallbackScope *)((long)&uStack_558 + 7));
        if (local_478 != (code *)0x0) {
          (*local_478)(&local_488,&local_488,3);
        }
        std::
        vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
        ::~vector(&local_3a8);
        pstd::pmr::memory_resource::~memory_resource((memory_resource *)local_320);
        return;
      }
      __s1 = pauStack_460;
      _Var10._M_p = local_468._M_p;
      switch((*pauStack_460)[0]) {
      case 0x41:
        switch(local_468._M_p) {
        case (pointer)0x9:
          iVar5 = bcmp(pauStack_460,"Attribute",(size_t)local_468._M_p);
          apiFunc = 0xe9;
          psVar8 = local_a8;
          if (iVar5 != 0) {
            _Var10._M_p = &DAT_00000009;
            goto switchD_002800fd_caseD_a;
          }
          break;
        default:
switchD_002800fd_caseD_a:
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,__s1,(undefined1 *)((long)_Var10._M_p + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        case (pointer)0xb:
          iVar5 = bcmp(pauStack_460,"Accelerator",(size_t)local_468._M_p);
          apiFunc = 0xa1;
          psVar8 = local_120;
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0xb;
            goto switchD_002800fd_caseD_a;
          }
          break;
        case (pointer)0xc:
          iVar5 = bcmp(pauStack_460,"AttributeEnd",(size_t)local_468._M_p);
          lVar6 = 0xe0;
          psVar8 = local_90;
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0xc;
            goto switchD_002800fd_caseD_a;
          }
          goto LAB_00281a53;
        case (pointer)0xe:
          lVar6 = 0xd8;
          psVar8 = local_78;
          if (*(long *)(*pauStack_460 + 6) != 0x6e69676542657475 ||
              *(long *)*pauStack_460 != 0x7475626972747441) {
            _Var10._M_p = (pointer)0xe;
            goto switchD_002800fd_caseD_a;
          }
LAB_00281a53:
          psVar8[2] = (size_t)local_448;
          *psVar8 = aStack_458._M_allocated_capacity;
          psVar8[1] = aStack_458._8_8_;
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (**(code **)((long)local_550->_vptr_SceneRepresentation + lVar6))();
          goto LAB_00281a8e;
        case (pointer)0xf:
          iVar5 = bcmp(pauStack_460,"ActiveTransform",(size_t)local_468._M_p);
          if (iVar5 == 0) {
            local_4b8._0_4_ = 1;
            if (local_478 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            t_00 = (char *)&local_488;
            (*local_470)(local_548,&local_488,local_4b8);
            if ((undefined1)local_528[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            if ((memory_resource *)local_548._0_8_ == (memory_resource *)&DAT_00000009) {
              t_00 = "StartTime";
              iVar5 = bcmp((void *)local_548._8_8_,"StartTime",9);
              if (iVar5 == 0) {
                lVar6 = 0x78;
                psVar8 = local_f0;
                goto joined_r0x00281d75;
              }
            }
            else if ((memory_resource *)local_548._0_8_ == (memory_resource *)0x7) {
              t_00 = "EndTime";
              iVar5 = bcmp((void *)local_548._8_8_,"EndTime",7);
              if (iVar5 == 0) {
                lVar6 = 0x70;
                psVar8 = local_d8;
                goto joined_r0x00281d75;
              }
            }
            else if (((memory_resource *)local_548._0_8_ == (memory_resource *)0x3) &&
                    (((undefined1 *)local_548._8_8_)[2] == 'l' &&
                     *(short *)(undefined1 *)local_548._8_8_ == 0x6c41)) {
              lVar6 = 0x68;
              psVar8 = local_c0;
joined_r0x00281d75:
              if (local_440 == '\0') goto LAB_0028291e;
              psVar8[2] = (size_t)local_448;
              *psVar8 = aStack_458._M_allocated_capacity;
              psVar8[1] = aStack_458._8_8_;
              in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
              in_stack_fffffffffffffa8c = (undefined4)(aStack_458._M_allocated_capacity >> 0x20);
              (**(code **)((long)local_550->_vptr_SceneRepresentation + lVar6))();
              goto LAB_00281a8e;
            }
            if (local_440 == '\x01') {
              parse::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_468,(Token *)t_00);
            }
LAB_0028291e:
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          apiFunc = 0x129;
          psVar8 = local_108;
          if (*(long *)(*__s1 + 7) != 0x656372756f537468 || *(long *)*__s1 != 0x6867694c61657241) {
            _Var10._M_p = (pointer)0xf;
            goto switchD_002800fd_caseD_a;
          }
        }
        break;
      default:
        local_548._0_8_ = local_548 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
        ErrorExit<std::__cxx11::string>
                  ((FileLoc *)&aStack_458,"Unknown directive: %s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
      case 0x43:
        if ((pointer)0xb < local_468._M_p + -6) {
switchD_002809b8_caseD_7:
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,__s1,(undefined1 *)((long)_Var10._M_p + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        }
        switch(local_468._M_p) {
        case (pointer)0x6:
          iVar5 = bcmp(pauStack_460,"Camera",(size_t)local_468._M_p);
          apiFunc = 0xb1;
          psVar8 = local_138;
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x6;
            goto switchD_002809b8_caseD_7;
          }
          goto LAB_00281a02;
        default:
          goto switchD_002809b8_caseD_7;
        case (pointer)0xa:
          iVar5 = bcmp(pauStack_460,"ColorSpace",(size_t)local_468._M_p);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0xa;
            goto switchD_002809b8_caseD_7;
          }
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          pSVar3 = local_550;
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*pSVar3->_vptr_SceneRepresentation[0x11])(pSVar3,(Token *)local_548);
          break;
        case (pointer)0xf:
          if (*(long *)(*pauStack_460 + 7) != 0x6d726f66736e6172 ||
              *(long *)*pauStack_460 != 0x72547461636e6f43) {
            _Var10._M_p = (pointer)0xf;
            goto switchD_002809b8_caseD_7;
          }
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,(Token *)local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          if (((memory_resource *)local_548._0_8_ != (memory_resource *)0x1) ||
             (*(undefined1 *)local_548._8_8_ != '[')) {
            if (local_440 != '\0') {
              local_548._0_8_ = local_548 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
              ErrorExit<std::__cxx11::string>
                        ((FileLoc *)&aStack_458,"Unknown directive: %s",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_548);
            }
LAB_00282822:
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          lVar6 = 0;
          do {
            local_4e0._0_4_ = 1;
            if (local_478 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_470)((Token *)local_4b8,&local_488,local_4e0);
            if (local_490 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            dVar16 = parseNumber((Token *)local_4b8);
            *(float *)(local_548 + lVar6 * 4) = (float)dVar16;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
          local_4e0._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_4b8,&local_488,local_4e0);
          if (local_490 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          if (((memory_resource *)local_4b8._0_8_ != (memory_resource *)0x1) ||
             (*(undefined1 *)local_4b8._8_8_ != ']')) {
            if (local_440 != '\0') {
              local_4b8._0_8_ = pmVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4b8,pauStack_460,local_468._M_p + (long)pauStack_460);
              ErrorExit<std::__cxx11::string>
                        ((FileLoc *)&aStack_458,"Unknown directive: %s",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b8);
            }
LAB_00282246:
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          if (local_440 == '\0') goto LAB_00282246;
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*local_550->_vptr_SceneRepresentation[9])(local_550,(Token *)local_548);
          goto LAB_00281a8e;
        case (pointer)0x10:
          iVar5 = bcmp(pauStack_460,"CoordinateSystem",(size_t)local_468._M_p);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x10;
            goto switchD_002809b8_caseD_7;
          }
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          pSVar3 = local_550;
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*pSVar3->_vptr_SceneRepresentation[0xb])(pSVar3,(Token *)local_548);
          break;
        case (pointer)0x11:
          iVar5 = bcmp(pauStack_460,"CoordSysTransform",(size_t)local_468._M_p);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x11;
            goto switchD_002809b8_caseD_7;
          }
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          pSVar3 = local_550;
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*pSVar3->_vptr_SceneRepresentation[0xc])(pSVar3,(Token *)local_548);
        }
        goto LAB_002818f1;
      case 0x46:
        if ((long *)local_468._M_p != (long *)0x4) {
LAB_00281fd2:
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        }
        apiFunc = 0x99;
        psVar8 = local_150;
        if (*(int *)*pauStack_460 != 0x6d6c6946) goto LAB_00281fd2;
        break;
      case 0x49:
        if ((long *)local_468._M_p == (long *)0x7) {
          iVar5 = bcmp(pauStack_460,"Include",7);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x7;
            goto LAB_002822ba;
          }
          local_4e0._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((string *)local_548,&local_488,local_4e0);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          local_4b8._32_8_ = local_528[0];
          local_4b8._0_8_ = local_548._0_8_;
          local_4b8._8_8_ = local_548._8_8_;
          local_4b8._16_8_ = auStack_538._0_8_;
          local_4b8._24_8_ = auStack_538._8_8_;
          sVar17 = dequoteString((Token *)local_4b8);
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          if (uStack_558._6_1_ == 1) {
            lVar6 = __dynamic_cast(local_550,&SceneRepresentation::typeinfo,
                                   &FormattingScene::typeinfo,0);
            local_4e0._0_8_ = pmVar1;
            std::__cxx11::string::_M_construct((ulong)local_4e0,(char)*(undefined4 *)(lVar6 + 0xc));
            Printf<std::__cxx11::string,std::__cxx11::string&>
                      ("%sInclude \"%s\"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4e0,(string *)local_548);
            if ((memory_resource *)local_4e0._0_8_ != pmVar1) {
              operator_delete((void *)local_4e0._0_8_,(ulong)(local_4d0._M_allocated_capacity + 1));
            }
          }
          else {
            ResolveFilename((string *)local_4e0,(string *)local_548);
            std::__cxx11::string::operator=((string *)local_548,(string *)local_4e0);
            if ((memory_resource *)local_4e0._0_8_ != pmVar1) {
              operator_delete((void *)local_4e0._0_8_,(ulong)(local_4d0._M_allocated_capacity + 1));
            }
            local_3c8._M_unused._M_object = (void *)0x0;
            local_3c8._8_8_ = 0;
            local_3b0 = std::
                        _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:542:23)>
                        ::_M_invoke;
            local_3b8 = std::
                        _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:542:23)>
                        ::_M_manager;
            Tokenizer::CreateFromFile
                      ((Tokenizer *)local_4e0,(string *)local_548,
                       (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_3c8);
            if (local_3b8 != (code *)0x0) {
              (*local_3b8)(&local_3c8,&local_3c8,__destroy_functor);
            }
            if ((memory_resource *)local_4e0._0_8_ != (memory_resource *)0x0) {
              std::
              vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
              ::emplace_back<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>
                        ((vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
                          *)&local_3a8,
                         (unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                         local_4e0);
            }
            std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                      ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                       local_4e0);
          }
          goto LAB_002818f1;
        }
        if ((long *)local_468._M_p == (long *)0x8) {
          iVar5 = bcmp(pauStack_460,"Identity",8);
          lVar6 = 0x28;
          psVar8 = local_180;
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x8;
            goto LAB_002822ba;
          }
          goto LAB_00281a53;
        }
        if ((long *)local_468._M_p != (long *)0xa) {
LAB_002822ba:
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,__s1,(undefined1 *)((long)_Var10._M_p + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        }
        apiFunc = 0xa9;
        psVar8 = local_168;
        if (*(short *)(*pauStack_460 + 8) != 0x726f || *(long *)*pauStack_460 != 0x7461726765746e49)
        {
          _Var10._M_p = (pointer)0xa;
          goto LAB_002822ba;
        }
        break;
      case 0x4c:
        if ((long *)local_468._M_p != (long *)0x6) {
          if ((long *)local_468._M_p != (long *)0xb) {
LAB_0028203a:
            local_548._0_8_ = local_548 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)&aStack_458,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_548);
          }
          apiFunc = 0x121;
          psVar8 = local_198;
          if (*(long *)(*pauStack_460 + 3) != 0x656372756f537468 ||
              *(long *)*pauStack_460 != 0x756f53746867694c) goto LAB_0028203a;
          break;
        }
        if (*(short *)(*pauStack_460 + 4) != 0x7441 || *(int *)*pauStack_460 != 0x6b6f6f4c)
        goto LAB_0028203a;
        lVar6 = 0;
        do {
          local_4e0._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_4e0);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          dVar16 = parseNumber((Token *)local_548);
          *(float *)(local_4b8 + lVar6 * 4) = (float)dVar16;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 9);
        if (local_440 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        in_stack_fffffffffffffa88 = local_4b8._32_4_;
        (*local_550->_vptr_SceneRepresentation[8])
                  (local_4b8._0_8_ & 0xffffffff,(ulong)local_4b8._0_8_ >> 0x20,
                   local_4b8._8_8_ & 0xffffffff,(ulong)local_4b8._8_8_ >> 0x20,
                   local_4b8._16_8_ & 0xffffffff,(ulong)local_4b8._16_8_ >> 0x20,
                   local_4b8._24_8_ & 0xffffffff,(ulong)local_4b8._24_8_ >> 0x20);
        goto LAB_00281a8e;
      case 0x4d:
        if ((long *)local_468._M_p == (long *)0x8) {
          iVar5 = bcmp(pauStack_460,"Material",8);
          apiFunc = 0x109;
          psVar8 = local_1e0;
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x8;
            goto LAB_0028252b;
          }
        }
        else if ((long *)local_468._M_p == (long *)0xf) {
          iVar5 = bcmp(pauStack_460,"MakeNamedMedium",0xf);
          if (iVar5 != 0) {
            iVar5 = bcmp(__s1,"MediumInterface",0xf);
            if (iVar5 != 0) {
              _Var10._M_p = (pointer)0xf;
              goto LAB_0028252b;
            }
            local_4b8._0_4_ = 1;
            if (local_478 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_470)((Token *)local_548,&local_488,local_4b8);
            if ((undefined1)local_528[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            sVar17 = dequoteString((Token *)local_548);
            lVar6 = 0x10;
            do {
              lVar7 = lVar6 + 0x20;
              *(undefined1 **)((long)&uStack_558 + lVar6) = local_548 + lVar6;
              *(undefined8 *)((long)&local_550 + lVar6) = 0;
              local_548[lVar6] = 0;
              lVar6 = lVar7;
            } while (lVar7 != 0x50);
            local_4b8._0_8_ = pmVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4b8,sVar17._M_str,sVar17._M_str + sVar17._M_len);
            std::__cxx11::string::operator=((string *)local_548,(string *)local_4b8);
            if ((memory_resource *)local_4b8._0_8_ != pmVar2) {
              operator_delete((void *)local_4b8._0_8_,(ulong)(local_4b8._16_8_ + 1));
            }
            local_4e0._0_8_ = local_4e0._0_8_ & 0xffffffff00000000;
            if (local_478 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_470)((Token *)local_4b8,&local_488,local_4e0);
            if (local_490 == '\x01') {
              if ((((ulong)local_4b8._0_8_ < (memory_resource *)0x2) ||
                  (*(undefined1 *)local_4b8._8_8_ != '\"')) ||
                 ((*(undefined1 (*) [16])(local_4b8._8_8_ + -0x10) + 0xf)[local_4b8._0_8_] != '\"'))
              {
                if ((local_3f8.ungetToken)->set == true) {
                  LogFatal<char_const(&)[24]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
                             ,0x244,"Check failed: %s",(char (*) [24])"!ungetToken.has_value()");
                }
                *(undefined8 *)((long)&(local_3f8.ungetToken)->optionalValue + 0x20) =
                     local_4b8._32_8_;
                *(undefined8 *)&(local_3f8.ungetToken)->optionalValue = local_4b8._0_8_;
                *(undefined8 *)((long)&(local_3f8.ungetToken)->optionalValue + 8) = local_4b8._8_8_;
                *(undefined8 *)((long)&(local_3f8.ungetToken)->optionalValue + 0x10) =
                     local_4b8._16_8_;
                *(undefined8 *)((long)&(local_3f8.ungetToken)->optionalValue + 0x18) =
                     local_4b8._24_8_;
                (local_3f8.ungetToken)->set = true;
                goto LAB_00281c33;
              }
              sVar17 = dequoteString((Token *)local_4b8);
              local_4e0._0_8_ = pmVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4e0,sVar17._M_str,sVar17._M_str + sVar17._M_len);
              std::__cxx11::string::operator=((string *)local_528,(string *)local_4e0);
              if ((memory_resource *)local_4e0._0_8_ != pmVar1) {
                operator_delete((void *)local_4e0._0_8_,(ulong)(local_4d0._M_allocated_capacity + 1)
                               );
              }
            }
            else {
LAB_00281c33:
              std::__cxx11::string::_M_assign((string *)local_528);
            }
            if (local_440 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
            in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
            (*local_550->_vptr_SceneRepresentation[0x18])(local_550,local_548,local_528);
            lVar6 = -0x40;
            plVar12 = local_528 + 2;
            do {
              if (plVar12 != (long *)plVar12[-2]) {
                operator_delete((long *)plVar12[-2],*plVar12 + 1);
              }
              plVar12 = plVar12 + -4;
              lVar6 = lVar6 + 0x20;
            } while (lVar6 != 0);
            goto LAB_00281a8e;
          }
          apiFunc = 0xb9;
          psVar8 = local_1c8;
        }
        else {
          if ((long *)local_468._M_p != (long *)0x11) {
LAB_0028252b:
            local_548._0_8_ = local_548 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_548,__s1,(undefined1 *)((long)_Var10._M_p + (long)__s1));
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)&aStack_458,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_548);
          }
          apiFunc = 0x111;
          psVar8 = local_1b0;
          auVar15 = vpternlogq_avx512vl(s_MakeNamedMaterial_004fee80._0_16_ ^ *pauStack_460,
                                        ZEXT116((byte)pauStack_460[1][0]),ram0x004fee90,0xf6);
          if (auVar15 != (undefined1  [16])0x0) {
            _Var10._M_p = (pointer)0x11;
            goto LAB_0028252b;
          }
        }
        break;
      case 0x4e:
        if (((long *)local_468._M_p != (long *)0xd) ||
           (*(long *)(*pauStack_460 + 5) != 0x6c6169726574614d ||
            *(long *)*pauStack_460 != 0x74614d64656d614e)) {
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        }
        local_4b8._0_4_ = 1;
        if (local_478 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*local_470)((Token *)local_548,&local_488,local_4b8);
        if ((undefined1)local_528[1] == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        sVar17 = dequoteString((Token *)local_548);
        pSVar3 = local_550;
        local_548._0_8_ = local_548 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_548,sVar17._M_str,sVar17._M_str + sVar17._M_len);
        if (local_440 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
        in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
        (*pSVar3->_vptr_SceneRepresentation[0x23])(pSVar3,(Token *)local_548);
        goto LAB_002818f1;
      case 0x4f:
        if ((pointer)0x8 < local_468._M_p + -6) {
switchD_002807d0_caseD_7:
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,__s1,(undefined1 *)((long)_Var10._M_p + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        }
        switch(local_468._M_p) {
        case (pointer)0x6:
          iVar5 = bcmp(pauStack_460,"Option",(size_t)local_468._M_p);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x6;
            goto switchD_002807d0_caseD_7;
          }
          local_4e0._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,(string *)local_4e0);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          local_4b8._0_8_ = pmVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4b8,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          local_438[0] = (long *)CONCAT44(local_438[0]._4_4_,1);
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_438);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          local_4e0._0_8_ = pmVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4e0,local_548._8_8_,
                     (pointer)(local_548._0_8_ + local_548._8_8_));
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*local_550->_vptr_SceneRepresentation[4])(local_550,local_4b8,local_4e0);
          if ((memory_resource *)local_4e0._0_8_ != pmVar1) {
            operator_delete((void *)local_4e0._0_8_,(ulong)(local_4d0._M_allocated_capacity + 1));
          }
          uVar13 = local_4b8._16_8_;
          pmVar14 = (memory_resource *)local_4b8._0_8_;
          if ((memory_resource *)local_4b8._0_8_ == pmVar2) goto LAB_00281a8e;
          goto LAB_002818ff;
        default:
          goto switchD_002807d0_caseD_7;
        case (pointer)0x9:
          iVar5 = bcmp(pauStack_460,"ObjectEnd",(size_t)local_468._M_p);
          lVar6 = 0x140;
          psVar8 = local_1f8;
          if (iVar5 != 0) {
            _Var10._M_p = &DAT_00000009;
            goto switchD_002807d0_caseD_7;
          }
          goto LAB_00281a53;
        case (pointer)0xb:
          if (*(long *)(*pauStack_460 + 3) != 0x6e69676542746365 ||
              *(long *)*pauStack_460 != 0x65427463656a624f) {
            _Var10._M_p = (pointer)0xb;
            goto switchD_002807d0_caseD_7;
          }
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          pSVar3 = local_550;
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*pSVar3->_vptr_SceneRepresentation[0x27])(pSVar3,(Token *)local_548);
          break;
        case (pointer)0xe:
          iVar5 = bcmp(pauStack_460,"ObjectInstance",(size_t)local_468._M_p);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0xe;
            goto switchD_002807d0_caseD_7;
          }
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          pSVar3 = local_550;
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*pSVar3->_vptr_SceneRepresentation[0x29])(pSVar3,(Token *)local_548);
        }
LAB_002818f1:
        uVar13 = auStack_538._0_8_;
        pmVar14 = (memory_resource *)local_548._0_8_;
        if ((memory_resource *)local_548._0_8_ != (memory_resource *)(local_548 + 0x10)) {
LAB_002818ff:
          operator_delete(pmVar14,(ulong)((long)&(((ParsedParameter *)uVar13)->type)._M_dataplus.
                                                 _M_p + 1));
        }
        goto LAB_00281a8e;
      case 0x50:
        if ((long *)local_468._M_p != (long *)0xb) {
LAB_00282006:
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        }
        apiFunc = 0x91;
        psVar8 = local_210;
        if (*(long *)(*pauStack_460 + 3) != 0x7265746c69466c65 ||
            *(long *)*pauStack_460 != 0x6c69466c65786950) goto LAB_00282006;
        break;
      case 0x52:
        if ((long *)local_468._M_p != (long *)0x6) {
          if ((long *)local_468._M_p != (long *)0x12) {
LAB_0028206e:
            local_548._0_8_ = local_548 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)&aStack_458,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_548);
          }
          lVar6 = 0x130;
          psVar8 = local_228;
          auVar15 = vpternlogq_avx512vl(s_ReverseOrientation_004fee60._0_16_ ^ *pauStack_460,
                                        ZEXT216(*(ushort *)pauStack_460[1]),ram0x004fee70,0xf6);
          if (auVar15 != (undefined1  [16])0x0) goto LAB_0028206e;
          goto LAB_00281a53;
        }
        if (*(short *)(*pauStack_460 + 4) != 0x6574 || *(int *)*pauStack_460 != 0x61746f52)
        goto LAB_0028206e;
        lVar6 = 0;
        do {
          local_4e0._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((Token *)local_548,&local_488,local_4e0);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          dVar16 = parseNumber((Token *)local_548);
          *(float *)(local_4b8 + lVar6 * 4) = (float)dVar16;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        if (local_440 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
        in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
        (*local_550->_vptr_SceneRepresentation[7])
                  (local_4b8._0_8_ & 0xffffffff,(ulong)local_4b8._0_8_ >> 0x20,
                   local_4b8._8_8_ & 0xffffffff,(ulong)local_4b8._8_8_ >> 0x20);
        goto LAB_00281a8e;
      case 0x53:
        if ((long *)local_468._M_p == (long *)0x7) {
          iVar5 = bcmp(pauStack_460,"Sampler",7);
          apiFunc = 0xc9;
          psVar8 = local_258;
          if (iVar5 != 0) goto LAB_002820a2;
        }
        else {
          if (local_468._M_p != &DAT_00000005) {
LAB_002820a2:
            local_548._0_8_ = local_548 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_548,__s1,_Var10._M_p + (long)__s1);
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)&aStack_458,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_548);
          }
          if ((*pauStack_460)[4] != 'e' || *(int *)*pauStack_460 != 0x70616853) {
            iVar5 = bcmp(pauStack_460,"Scale",5);
            if (iVar5 != 0) goto LAB_002820a2;
            lVar6 = 0;
            do {
              local_4e0._0_4_ = 1;
              if (local_478 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*local_470)((Token *)local_548,&local_488,local_4e0);
              if ((undefined1)local_528[1] == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
              }
              dVar16 = parseNumber((Token *)local_548);
              *(float *)(local_4b8 + lVar6 * 4) = (float)dVar16;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            if (local_440 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
            in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
            (**local_550->_vptr_SceneRepresentation)
                      (local_4b8._0_8_ & 0xffffffff,(ulong)local_4b8._0_8_ >> 0x20,
                       local_4b8._8_8_ & 0xffffffff);
            goto LAB_00281a8e;
          }
          apiFunc = 9;
          psVar8 = local_240;
        }
        break;
      case 0x54:
        if ((pointer)0x7 < local_468._M_p + -7) {
switchD_00280154_caseD_8:
          local_548._0_8_ = local_548 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,__s1,(undefined1 *)((long)_Var10._M_p + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)&aStack_458,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548)
          ;
        }
        switch(local_468._M_p) {
        case (pointer)0x7:
          iVar5 = bcmp(pauStack_460,"Texture",(size_t)local_468._M_p);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0x7;
            goto switchD_00280154_caseD_8;
          }
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((ParsedParameterVector *)local_548,&local_488,local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          local_4e0._0_8_ = pmVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4e0,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          local_4b8._0_4_ = 1;
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((ParsedParameterVector *)local_548,&local_488,local_4b8);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          sVar17 = dequoteString((Token *)local_548);
          local_438[0] = local_428;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          local_418[0] = (long *)CONCAT44(local_418[0]._4_4_,1);
          if (local_478 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_470)((ParsedParameterVector *)local_548,&local_488,local_418);
          if ((undefined1)local_528[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          local_4b8._32_8_ = local_528[0];
          local_4b8._0_8_ = local_548._0_8_;
          local_4b8._8_8_ = local_548._8_8_;
          local_4b8._16_8_ = auStack_538._0_8_;
          local_4b8._24_8_ = auStack_538._8_8_;
          sVar17 = dequoteString((Token *)local_4b8);
          local_418[0] = local_408;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_418,sVar17._M_str,sVar17._M_str + sVar17._M_len);
          std::function<pstd::optional<pbrt::Token>_(int)>::function
                    ((function<pstd::optional<pbrt::Token>_(int)> *)&local_340,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_488);
          alloc_00.memoryResource._1_7_ = 0;
          alloc_00.memoryResource._0_1_ = uStack_558._6_1_;
          local_3e8 = &local_4b9;
          local_3e0 = 0;
          local_3d0 = std::
                      _Function_handler<void_(const_pbrt::Token_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:838:21)>
                      ::_M_invoke;
          local_3d8 = std::
                      _Function_handler<void_(const_pbrt::Token_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:838:21)>
                      ::_M_manager;
          parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
                    ((ParsedParameterVector *)local_548,(pbrt *)local_340._M_pod_data,
                     (function<pstd::optional<pbrt::Token>_(int)> *)local_3f8.ungetToken,
                     (anon_class_8_1_6da50f9a)local_3f0.memoryResource,alloc_00,SUB81(&local_3e8,0),
                     (function<void_(const_pbrt::Token_&,_const_char_*)> *)
                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          if (local_3d8 != (code *)0x0) {
            (*local_3d8)(&local_3e8,&local_3e8,3);
          }
          if (local_330 != (code *)0x0) {
            (*local_330)(&local_340,&local_340,__destroy_functor);
          }
          pSVar3 = local_550;
          InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                           *)(local_320 + 0x20),(ParsedParameterVector *)local_548);
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*pSVar3->_vptr_SceneRepresentation[0x20])
                    (pSVar3,local_4e0,local_438,local_418,
                     (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)(local_320 + 0x20));
          local_2a8 = 0;
          (**(code **)(*(long *)local_320._32_8_ + 0x18))
                    (local_320._32_8_,local_320._40_8_,local_2b0 << 3,8);
          local_4f0 = 0;
          (*(*(_func_int ***)local_548._0_8_)[3])(local_548._0_8_,local_548._8_8_,local_4f8 << 3,8);
          if (local_418[0] != local_408) {
            operator_delete(local_418[0],local_408[0] + 1);
          }
          if (local_438[0] != local_428) {
            operator_delete(local_438[0],local_428[0] + 1);
          }
          uVar13 = local_4d0._M_allocated_capacity;
          pmVar14 = (memory_resource *)local_4e0._0_8_;
          if ((memory_resource *)local_4e0._0_8_ != (memory_resource *)(local_4e0 + 0x10))
          goto LAB_002818ff;
          break;
        default:
          goto switchD_00280154_caseD_8;
        case (pointer)0x9:
          iVar5 = bcmp(pauStack_460,"Transform",(size_t)local_468._M_p);
          if (iVar5 == 0) {
            local_4b8._0_4_ = 1;
            if (local_478 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_470)((ParsedParameterVector *)local_548,&local_488,(Token *)local_4b8);
            if ((undefined1)local_528[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            if (((memory_resource *)local_548._0_8_ != (memory_resource *)0x1) ||
               (*(undefined1 *)local_548._8_8_ != '[')) {
              if (local_440 == '\x01') {
                local_548._0_8_ = local_548 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
                ErrorExit<std::__cxx11::string>
                          ((FileLoc *)&aStack_458,"Unknown directive: %s",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_548);
              }
              goto LAB_00282822;
            }
            lVar6 = 0;
            do {
              local_4e0._0_4_ = 1;
              if (local_478 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*local_470)((Token *)local_4b8,&local_488,local_4e0);
              if (local_490 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
              }
              dVar16 = parseNumber((Token *)local_4b8);
              *(float *)(local_548 + lVar6 * 4) = (float)dVar16;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x10);
            local_4e0._0_4_ = 1;
            if (local_478 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_470)((Token *)local_4b8,&local_488,local_4e0);
            if (local_490 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            if (((memory_resource *)local_4b8._0_8_ != (memory_resource *)0x1) ||
               (*(undefined1 *)local_4b8._8_8_ != ']')) {
              if (local_440 != '\0') {
                local_4b8._0_8_ = pmVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4b8,pauStack_460,local_468._M_p + (long)pauStack_460);
                ErrorExit<std::__cxx11::string>
                          ((FileLoc *)&aStack_458,"Unknown directive: %s",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b8);
              }
LAB_002827b6:
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            if (local_440 == '\0') goto LAB_002827b6;
            in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
            in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
            (*local_550->_vptr_SceneRepresentation[10])
                      (local_550,(ParsedParameterVector *)local_548);
          }
          else {
            if ((*__s1)[8] != 'e' || *(long *)*__s1 != 0x74616c736e617254) {
              _Var10._M_p = &DAT_00000009;
              goto switchD_00280154_caseD_8;
            }
            lVar6 = 0;
            do {
              local_4e0._0_4_ = 1;
              if (local_478 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*local_470)((ParsedParameterVector *)local_548,&local_488,local_4e0);
              if ((undefined1)local_528[1] == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
              }
              dVar16 = parseNumber((Token *)local_548);
              *(float *)(local_4b8 + lVar6 * 4) = (float)dVar16;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            if (local_440 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
            in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
            (*local_550->_vptr_SceneRepresentation[6])
                      (local_4b8._0_8_ & 0xffffffff,(ulong)local_4b8._0_8_ >> 0x20,
                       local_4b8._8_8_ & 0xffffffff);
          }
          break;
        case (pointer)0xc:
          iVar5 = bcmp(pauStack_460,"TransformEnd",(size_t)local_468._M_p);
          lVar6 = 0xf8;
          psVar8 = local_288;
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0xc;
            goto switchD_00280154_caseD_8;
          }
          goto LAB_00281a53;
        case (pointer)0xe:
          if (*(long *)(*pauStack_460 + 6) == 0x6e696765426d726f &&
              *(long *)*pauStack_460 == 0x726f66736e617254) {
            lVar6 = 0xf0;
            psVar8 = local_270;
            goto LAB_00281a53;
          }
          iVar5 = bcmp(pauStack_460,"TransformTimes",(size_t)local_468._M_p);
          if (iVar5 != 0) {
            _Var10._M_p = (pointer)0xe;
            goto switchD_00280154_caseD_8;
          }
          pplVar11 = (long **)local_4e0;
          bVar4 = true;
          do {
            bVar9 = bVar4;
            local_4b8._0_4_ = 1;
            if (local_478 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_470)((ParsedParameterVector *)local_548,&local_488,local_4b8);
            if ((undefined1)local_528[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            dVar16 = parseNumber((Token *)local_548);
            *(float *)pplVar11 = (float)dVar16;
            pplVar11 = local_438;
            bVar4 = false;
          } while (bVar9);
          if (local_440 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
          in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
          (*local_550->_vptr_SceneRepresentation[0x10])
                    (local_4e0._0_8_ & 0xffffffff,(ulong)local_438[0] & 0xffffffff);
        }
        goto LAB_00281a8e;
      case 0x57:
        if ((long *)local_468._M_p != (long *)0x8) {
          if ((long *)local_468._M_p != (long *)0xa) {
LAB_00281f6a:
            local_548._0_8_ = local_548 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_548,pauStack_460,local_468._M_p + (long)pauStack_460);
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)&aStack_458,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_548);
          }
          lVar6 = 0xd0;
          psVar8 = local_2a0;
          if (*(short *)(*pauStack_460 + 8) != 0x6e69 ||
              *(long *)*pauStack_460 != 0x676542646c726f57) goto LAB_00281f6a;
          goto LAB_00281a53;
        }
        if ((*(long *)*pauStack_460 != 0x646e45646c726f57) || (uStack_558._6_1_ == 0))
        goto LAB_00281f6a;
        goto LAB_00281a8e;
      }
LAB_00281a02:
      psVar8[2] = (size_t)local_448;
      *psVar8 = aStack_458._M_allocated_capacity;
      psVar8[1] = aStack_458._8_8_;
      in_stack_fffffffffffffa88 = (int)aStack_458._M_allocated_capacity;
      in_stack_fffffffffffffa8c = (undefined4)((ulong)aStack_458._0_8_ >> 0x20);
      loc.filename._M_str = (char *)aStack_458._8_8_;
      loc.filename._M_len = aStack_458._M_allocated_capacity;
      loc._16_8_ = local_448;
      parse::anon_class_48_6_0442aee5::operator()(&local_370,apiFunc,loc);
LAB_00281a8e:
      local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffff00000000;
    } while (local_478 != (code *)0x0);
  }
  std::__throw_bad_function_call();
}

Assistant:

static void parse(SceneRepresentation *scene, std::unique_ptr<Tokenizer> t) {
    bool formatting = dynamic_cast<FormattingScene *>(scene) != nullptr;
    TrackedMemoryResource memoryResource;
    Allocator alloc(&memoryResource);

    std::vector<std::unique_ptr<Tokenizer>> fileStack;
    fileStack.push_back(std::move(t));

    pstd::optional<Token> ungetToken;

    auto parseError = [&](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // nextToken is a little helper function that handles the file stack,
    // returning the next token from the current file until reaching EOF,
    // at which point it switches to the next file (if any).
    std::function<pstd::optional<Token>(int)> nextToken;
    nextToken = [&](int flags) -> pstd::optional<Token> {
        if (ungetToken.has_value())
            return std::exchange(ungetToken, {});

        if (fileStack.empty()) {
            if ((flags & TokenRequired) != 0) {
                ErrorExit("premature end of file");
            }
            return {};
        }

        pstd::optional<Token> tok = fileStack.back()->Next();

        if (!tok) {
            // We've reached EOF in the current file. Anything more to parse?
            fileStack.pop_back();
            return nextToken(flags);
        } else if (tok->token[0] == '#') {
            // Swallow comments, unless --format or --toply was given, in
            // which case they're printed to stdout.
            if (formatting)
                printf("%s%s\n", dynamic_cast<FormattingScene *>(scene)->indent().c_str(),
                       toString(tok->token).c_str());
            return nextToken(flags);
        } else
            // Regular token; success.
            return tok;
    };

    auto unget = [&](Token t) {
        CHECK(!ungetToken.has_value());
        ungetToken = t;
    };

    // Helper function for pbrt API entrypoints that take a single string
    // parameter and a ParameterVector (e.g. pbrtShape()).
    // using BasicEntrypoint = void (ParsedScene::*)(const std::string &,
    // ParsedParameterVector, FileLoc);
    auto basicParamListEntrypoint = [&](void (SceneRepresentation::*apiFunc)(
                                            const std::string &, ParsedParameterVector,
                                            FileLoc),
                                        FileLoc loc) {
        Token t = *nextToken(TokenRequired);
        std::string_view dequoted = dequoteString(t);
        std::string n = toString(dequoted);
        ParsedParameterVector parameterVector = parseParameters(
            nextToken, unget, alloc, formatting, [&](const Token &t, const char *msg) {
                std::string token = toString(t.token);
                std::string str = StringPrintf("%s: %s", token, msg);
                parseError(str.c_str(), &t.loc);
            });
        (scene->*apiFunc)(n, std::move(parameterVector), loc);
    };

    auto syntaxError = [&](const Token &t) {
        ErrorExit(&t.loc, "Unknown directive: %s", toString(t.token));
    };

    pstd::optional<Token> tok;
    CheckCallbackScope _([&tok]() -> std::string {
        if (!tok.has_value())
            return "";
        std::string filename(tok->loc.filename.begin(), tok->loc.filename.end());
        return StringPrintf("Current parser location %s:%d:%d", filename, tok->loc.line,
                            tok->loc.column);
    });

    while (true) {
        tok = nextToken(TokenOptional);
        if (!tok.has_value())
            break;

        switch (tok->token[0]) {
        case 'A':
            if (tok->token == "AttributeBegin")
                scene->AttributeBegin(tok->loc);
            else if (tok->token == "AttributeEnd")
                scene->AttributeEnd(tok->loc);
            else if (tok->token == "Attribute")
                basicParamListEntrypoint(&SceneRepresentation::Attribute, tok->loc);
            else if (tok->token == "ActiveTransform") {
                Token a = *nextToken(TokenRequired);
                if (a.token == "All")
                    scene->ActiveTransformAll(tok->loc);
                else if (a.token == "EndTime")
                    scene->ActiveTransformEndTime(tok->loc);
                else if (a.token == "StartTime")
                    scene->ActiveTransformStartTime(tok->loc);
                else
                    syntaxError(*tok);
            } else if (tok->token == "AreaLightSource")
                basicParamListEntrypoint(&SceneRepresentation::AreaLightSource, tok->loc);
            else if (tok->token == "Accelerator")
                basicParamListEntrypoint(&SceneRepresentation::Accelerator, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'C':
            if (tok->token == "ConcatTransform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->ConcatTransform(m, tok->loc);
            } else if (tok->token == "CoordinateSystem") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordinateSystem(toString(n), tok->loc);
            } else if (tok->token == "CoordSysTransform") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordSysTransform(toString(n), tok->loc);
            } else if (tok->token == "ColorSpace") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ColorSpace(toString(n), tok->loc);
            } else if (tok->token == "Camera")
                basicParamListEntrypoint(&SceneRepresentation::Camera, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'F':
            if (tok->token == "Film")
                basicParamListEntrypoint(&SceneRepresentation::Film, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'I':
            if (tok->token == "Integrator")
                basicParamListEntrypoint(&SceneRepresentation::Integrator, tok->loc);
            else if (tok->token == "Include") {
                Token filenameToken = *nextToken(TokenRequired);
                std::string filename = toString(dequoteString(filenameToken));
                if (formatting)
                    Printf("%sInclude \"%s\"\n",
                           dynamic_cast<FormattingScene *>(scene)->indent(), filename);
                else {
                    filename = ResolveFilename(filename);
                    std::unique_ptr<Tokenizer> tinc =
                        Tokenizer::CreateFromFile(filename, parseError);
                    if (tinc)
                        fileStack.push_back(std::move(tinc));
                }
            } else if (tok->token == "Identity")
                scene->Identity(tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'L':
            if (tok->token == "LightSource")
                basicParamListEntrypoint(&SceneRepresentation::LightSource, tok->loc);
            else if (tok->token == "LookAt") {
                Float v[9];
                for (int i = 0; i < 9; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->LookAt(v[0], v[1], v[2], v[3], v[4], v[5], v[6], v[7], v[8],
                              tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'M':
            if (tok->token == "MakeNamedMaterial")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMaterial,
                                         tok->loc);
            else if (tok->token == "MakeNamedMedium")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMedium, tok->loc);
            else if (tok->token == "Material")
                basicParamListEntrypoint(&SceneRepresentation::Material, tok->loc);
            else if (tok->token == "MediumInterface") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string names[2];
                names[0] = toString(n);

                // Check for optional second parameter
                pstd::optional<Token> second = nextToken(TokenOptional);
                if (second.has_value()) {
                    if (isQuotedString(second->token))
                        names[1] = toString(dequoteString(*second));
                    else {
                        unget(*second);
                        names[1] = names[0];
                    }
                } else
                    names[1] = names[0];

                scene->MediumInterface(names[0], names[1], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'N':
            if (tok->token == "NamedMaterial") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->NamedMaterial(toString(n), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'O':
            if (tok->token == "ObjectBegin") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectBegin(toString(n), tok->loc);
            } else if (tok->token == "ObjectEnd")
                scene->ObjectEnd(tok->loc);
            else if (tok->token == "ObjectInstance") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectInstance(toString(n), tok->loc);
            } else if (tok->token == "Option") {
                std::string name = toString(dequoteString(*nextToken(TokenRequired)));
                std::string value = toString(nextToken(TokenRequired)->token);
                scene->Option(name, value, tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'P':
            if (tok->token == "PixelFilter")
                basicParamListEntrypoint(&SceneRepresentation::PixelFilter, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'R':
            if (tok->token == "ReverseOrientation")
                scene->ReverseOrientation(tok->loc);
            else if (tok->token == "Rotate") {
                Float v[4];
                for (int i = 0; i < 4; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Rotate(v[0], v[1], v[2], v[3], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'S':
            if (tok->token == "Shape")
                basicParamListEntrypoint(&SceneRepresentation::Shape, tok->loc);
            else if (tok->token == "Sampler")
                basicParamListEntrypoint(&SceneRepresentation::Sampler, tok->loc);
            else if (tok->token == "Scale") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Scale(v[0], v[1], v[2], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'T':
            if (tok->token == "TransformBegin")
                scene->TransformBegin(tok->loc);
            else if (tok->token == "TransformEnd")
                scene->TransformEnd(tok->loc);
            else if (tok->token == "Transform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->Transform(m, tok->loc);
            } else if (tok->token == "Translate") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Translate(v[0], v[1], v[2], tok->loc);
            } else if (tok->token == "TransformTimes") {
                Float v[2];
                for (int i = 0; i < 2; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->TransformTimes(v[0], v[1], tok->loc);
            } else if (tok->token == "Texture") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string name = toString(n);
                n = dequoteString(*nextToken(TokenRequired));
                std::string type = toString(n);

                Token t = *nextToken(TokenRequired);
                std::string_view dequoted = dequoteString(t);
                std::string texName = toString(dequoted);
                ParsedParameterVector params = parseParameters(
                    nextToken, unget, alloc, formatting,
                    [&](const Token &t, const char *msg) {
                        std::string token = toString(t.token);
                        std::string str = StringPrintf("%s: %s", token, msg);
                        parseError(str.c_str(), &t.loc);
                    });

                scene->Texture(name, type, texName, std::move(params), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'W':
            if (tok->token == "WorldBegin")
                scene->WorldBegin(tok->loc);
            else if (tok->token == "WorldEnd" && formatting)
                ;  // just swallow it
            else
                syntaxError(*tok);
            break;

        default:
            syntaxError(*tok);
        }
    }
}